

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

int lyd_schema_sort(lyd_node *sibling,int recursive)

{
  uint uVar1;
  int iVar2;
  long *__base;
  lys_module *plVar3;
  lys_node *plVar4;
  lys_node *plVar5;
  lys_node *parent;
  lys_module *plVar6;
  lys_node *last;
  ulong uVar7;
  lyd_node *plVar8;
  char *format;
  LY_ERR no;
  ly_ctx *ctx;
  long *plVar9;
  ulong __nmemb;
  
  if (sibling == (lyd_node *)0x0) {
    format = "Invalid arguments (%s()).";
    ctx = (ly_ctx *)0x0;
    no = LY_EINVAL;
LAB_00166b6b:
    ly_log(ctx,LY_LLERR,no,format,"lyd_schema_sort");
LAB_00166b72:
    iVar2 = -1;
  }
  else {
    if (sibling->prev != sibling) {
      plVar8 = sibling;
      if (sibling->parent == (lyd_node *)0x0) {
        do {
          sibling = plVar8;
          plVar8 = sibling->prev;
        } while (sibling->prev->next != (lyd_node *)0x0);
LAB_001668e5:
        uVar1 = 0;
        plVar8 = sibling;
        do {
          uVar1 = uVar1 + 1;
          plVar8 = plVar8->next;
        } while (plVar8 != (lyd_node *)0x0);
      }
      else {
        sibling = sibling->parent->child;
        if (sibling != (lyd_node *)0x0) goto LAB_001668e5;
        sibling = (lyd_node *)0x0;
        uVar1 = 0;
      }
      __nmemb = (ulong)uVar1;
      __base = (long *)malloc(__nmemb << 4);
      if (__base == (long *)0x0) {
        ctx = sibling->schema->module->ctx;
        format = "Memory allocation failed (%s()).";
        no = LY_EMEM;
        goto LAB_00166b6b;
      }
      if (__nmemb == 0) {
        qsort(__base,0,0x10,lyd_node_pos_cmp);
      }
      else {
        uVar7 = 0;
        plVar4 = (lys_node *)0x0;
        plVar8 = sibling;
        do {
          *(undefined4 *)(__base + uVar7 * 2 + 1) = 0;
          if (plVar4 == (lys_node *)0x0) {
LAB_0016697b:
            plVar5 = plVar8->schema;
            while ((plVar4 = lys_parent(plVar5), plVar4 != (lys_node *)0x0 &&
                   (plVar4 = lys_parent(plVar5),
                   (plVar4->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN))) {
              plVar5 = lys_parent(plVar5);
            }
            plVar4 = lys_parent(plVar5);
            if (plVar4 == (lys_node *)0x0) {
              do {
                plVar4 = plVar5;
                plVar5 = plVar4->prev;
              } while (plVar4->prev->next != (lys_node *)0x0);
            }
            else {
              plVar4 = lys_parent(plVar5);
              plVar4 = plVar4->child;
            }
          }
          else {
            if (plVar8 == (lyd_node *)0x0) {
              plVar6 = (lys_module *)0x0;
            }
            else {
              plVar6 = plVar8->schema->module;
              if ((plVar6->field_0x40 & 1) != 0) {
                plVar6 = (lys_module *)plVar6->data;
              }
            }
            plVar3 = lys_node_module(plVar4);
            if (plVar6 != plVar3) goto LAB_0016697b;
          }
          plVar9 = __base + uVar7 * 2;
          plVar5 = plVar8->schema;
          last = (lys_node *)0x0;
          do {
            parent = lys_parent(plVar4);
            plVar6 = lys_node_module(plVar4);
            last = lys_getnext(last,parent,plVar6,0x100);
            if (last == (lys_node *)0x0) {
              ly_log(plVar4->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                     ,0x12e2);
              free(__base);
              goto LAB_00166b72;
            }
            *(int *)(plVar9 + 1) = (int)plVar9[1] + 1;
          } while (last != plVar5);
          *plVar9 = (long)plVar8;
          uVar7 = uVar7 + 1;
          plVar8 = plVar8->next;
        } while (uVar7 != __nmemb);
        qsort(__base,__nmemb,0x10,lyd_node_pos_cmp);
        if (uVar1 != 0) {
          uVar7 = 0;
          do {
            if (uVar7 == 0) {
              sibling = (lyd_node *)*__base;
              plVar8 = sibling;
              plVar9 = __base + (ulong)(uVar1 - 1) * 2;
              if (sibling->parent != (lyd_node *)0x0) {
                sibling->parent->child = sibling;
              }
            }
            else {
              plVar8 = (lyd_node *)__base[uVar7 * 2];
              plVar9 = __base + uVar7 * 2 + -2;
            }
            plVar8->prev = (lyd_node *)*plVar9;
            if (uVar7 < uVar1 - 1) {
              *(long *)(__base[uVar7 * 2] + 0x18) = __base[(uVar7 + 1) * 2];
            }
            else {
              *(undefined8 *)(__base[uVar7 * 2] + 0x18) = 0;
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 != __nmemb);
        }
      }
      free(__base);
    }
    iVar2 = 0;
    if (recursive != 0) {
      for (; iVar2 = 0, sibling != (lyd_node *)0x0; sibling = sibling->next) {
        if ((((sibling->schema->nodetype & (LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER)) !=
              LYS_UNKNOWN) && (sibling->child != (lyd_node *)0x0)) &&
           (iVar2 = lyd_schema_sort(sibling->child,recursive), iVar2 != 0)) goto LAB_00166b72;
      }
    }
  }
  return iVar2;
}

Assistant:

API int
lyd_schema_sort(struct lyd_node *sibling, int recursive)
{
    uint32_t len, i;
    struct lyd_node *node;
    struct lys_node *first_ssibling = NULL;
    struct lyd_node_pos *array;

    if (!sibling) {
        LOGARG;
        return -1;
    }

    /* something actually to sort */
    if (sibling->prev != sibling) {

        /* find the beginning */
        sibling = lyd_first_sibling(sibling);

        /* count siblings */
        len = 0;
        for (node = sibling; node; node = node->next) {
            ++len;
        }

        array = malloc(len * sizeof *array);
        LY_CHECK_ERR_RETURN(!array, LOGMEM(sibling->schema->module->ctx), -1);

        /* fill arrays with positions and corresponding nodes */
        for (i = 0, node = sibling; i < len; ++i, node = node->next) {
            array[i].pos = 0;

            /* we need to repeat this for every module */
            if (!first_ssibling || (lyd_node_module(node) != lys_node_module(first_ssibling))) {
                /* find the data node schema parent */
                first_ssibling = node->schema;
                while (lys_parent(first_ssibling)
                        && (lys_parent(first_ssibling)->nodetype & (LYS_CHOICE | LYS_CASE | LYS_USES))) {
                    first_ssibling = lys_parent(first_ssibling);
                }

                /* find the beginning */
                if (lys_parent(first_ssibling)) {
                    first_ssibling = lys_parent(first_ssibling)->child;
                } else {
                    while (first_ssibling->prev->next) {
                        first_ssibling = first_ssibling->prev;
                    }
                }
            }

            if (lys_module_node_pos_r(first_ssibling, node->schema, &array[i].pos)) {
                free(array);
                return -1;
            }

            array[i].node = node;
        }

        /* sort the arrays */
        qsort(array, len, sizeof *array, lyd_node_pos_cmp);

        /* adjust siblings based on the sorted array */
        for (i = 0; i < len; ++i) {
            /* parent child */
            if (i == 0) {
                /* adjust sibling so that it still points to the beginning */
                sibling = array[i].node;
                if (array[i].node->parent) {
                    array[i].node->parent->child = array[i].node;
                }
            }

            /* prev */
            if (i > 0) {
                array[i].node->prev = array[i - 1].node;
            } else {
                array[i].node->prev = array[len - 1].node;
            }

            /* next */
            if (i < len - 1) {
                array[i].node->next = array[i + 1].node;
            } else {
                array[i].node->next = NULL;
            }
        }
        free(array);
    }

    /* sort all the children recursively */
    if (recursive) {
        LY_TREE_FOR(sibling, node) {
            if ((node->schema->nodetype & (LYS_CONTAINER | LYS_LIST | LYS_RPC | LYS_ACTION | LYS_NOTIF))
                    && node->child && lyd_schema_sort(node->child, recursive)) {
                return -1;
            }
        }
    }

    return EXIT_SUCCESS;
}